

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall capnp::LocalClient::startResolveTask(LocalClient *this,Server *serverRef)

{
  anon_class_8_1_8991fb9c local_48;
  Maybe<kj::Promise<capnp::Capability::Client>_> local_40;
  Maybe<kj::ForkedPromise<void>_> local_30;
  Server *local_18;
  Server *serverRef_local;
  LocalClient *this_local;
  
  local_18 = serverRef;
  serverRef_local = (Server *)this;
  (*serverRef->_vptr_Server[2])();
  local_48.this = this;
  kj::Maybe<kj::Promise<capnp::Capability::Client>_>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:743:47)>
            (&local_30,&local_40,&local_48);
  kj::Maybe<kj::ForkedPromise<void>_>::operator=(&this->resolveTask,&local_30);
  kj::Maybe<kj::ForkedPromise<void>_>::~Maybe(&local_30);
  kj::Maybe<kj::Promise<capnp::Capability::Client>_>::~Maybe(&local_40);
  return;
}

Assistant:

void startResolveTask(Capability::Server& serverRef) {
    resolveTask = serverRef.shortenPath().map([this](kj::Promise<Capability::Client> promise) {
      KJ_IF_SOME(r, revoker) {
        promise = r.wrap(kj::mv(promise));
      }

      return promise.then([this](Capability::Client&& cap) {
        auto hook = ClientHook::from(kj::mv(cap));

        if (blocked) {
          // This is a streaming interface and we have some calls queued up as a result. We cannot
          // resolve directly to the new shorter path because this may allow new calls to hop
          // the queue -- we need to embargo new calls until the queue clears out.
          auto promise = kj::newAdaptedPromise<kj::Promise<void>, BlockedCall>(*this)
              .then([hook = kj::mv(hook)]() mutable { return kj::mv(hook); });
          hook = newLocalPromiseClient(kj::mv(promise));
        }

        resolved = kj::mv(hook);
      }).fork();
    });
  }